

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_precompile_nodeid(ly_ctx *ctx,char *str,lysc_nodeid **nodeid)

{
  LY_ERR LVar1;
  size_t expr_len;
  lysc_nodeid *plVar2;
  char **ppcVar3;
  char *pcVar4;
  uint uVar5;
  size_t len;
  char *pcVar6;
  lyxp_expr *exp;
  lyxp_expr *local_50;
  uint local_44;
  ly_ctx *local_40;
  char *local_38;
  
  local_50 = (lyxp_expr *)0x0;
  *nodeid = (lysc_nodeid *)0x0;
  expr_len = strlen(str);
  LVar1 = lyxp_expr_parse(ctx,str,expr_len,'\0',&local_50);
  if (LVar1 == LY_SUCCESS) {
    plVar2 = (lysc_nodeid *)calloc(1,0x20);
    *nodeid = plVar2;
    if (plVar2 != (lysc_nodeid *)0x0) {
      plVar2->str = str;
      uVar5 = 0;
      local_40 = ctx;
      local_38 = str;
      if (*local_50->tokens == LYXP_TOKEN_NAMETEST) goto LAB_00151b0e;
      while( true ) {
        if (local_50->used <= uVar5) {
          lyxp_expr_free(ctx,local_50);
          return LY_SUCCESS;
        }
        if (local_50->tokens[uVar5] != LYXP_TOKEN_OPER_PATH) {
          __assert_fail("exp->tokens[i] == LYXP_TOKEN_OPER_PATH",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x67,
                        "LY_ERR lys_precompile_nodeid(const struct ly_ctx *, const char *, struct lysc_nodeid **)"
                       );
        }
        uVar5 = uVar5 + 1;
        plVar2 = *nodeid;
LAB_00151b0e:
        pcVar6 = local_38;
        ppcVar3 = (char **)realloc(plVar2->prefix,(ulong)(plVar2->count + 1) << 3);
        if (ppcVar3 == (char **)0x0) break;
        (*nodeid)->prefix = ppcVar3;
        (*nodeid)->prefix[(*nodeid)->count] = (char *)0x0;
        ppcVar3 = (char **)realloc((*nodeid)->name,(ulong)((*nodeid)->count + 1) << 3);
        if (ppcVar3 == (char **)0x0) break;
        (*nodeid)->name = ppcVar3;
        (*nodeid)->name[(*nodeid)->count] = (char *)0x0;
        (*nodeid)->count = (*nodeid)->count + 1;
        if (local_50->tokens[uVar5] != LYXP_TOKEN_NAMETEST) {
          __assert_fail("exp->tokens[i] == LYXP_TOKEN_NAMETEST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x79,
                        "LY_ERR lys_precompile_nodeid(const struct ly_ctx *, const char *, struct lysc_nodeid **)"
                       );
        }
        pcVar6 = pcVar6 + local_50->tok_pos[uVar5];
        len = (size_t)local_50->tok_len[uVar5];
        local_44 = uVar5;
        pcVar4 = ly_strnchr(pcVar6,0x3a,len);
        if (pcVar4 != (char *)0x0) {
          LVar1 = lydict_insert(ctx,pcVar6,(long)pcVar4 - (long)pcVar6,
                                (*nodeid)->prefix + ((*nodeid)->count - 1));
          ctx = local_40;
          if (LVar1 != LY_SUCCESS) goto LAB_00151c5e;
          len = len + ~((long)pcVar4 - (long)pcVar6);
          pcVar6 = pcVar4 + 1;
        }
        LVar1 = lydict_insert(ctx,pcVar6,len,(*nodeid)->name + ((*nodeid)->count - 1));
        if (LVar1 != LY_SUCCESS) goto LAB_00151c5e;
        uVar5 = local_44 + 1;
      }
    }
    LVar1 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_precompile_nodeid");
  }
LAB_00151c5e:
  lyxp_expr_free(ctx,local_50);
  lysc_nodeid_free(ctx,*nodeid);
  *nodeid = (lysc_nodeid *)0x0;
  return LVar1;
}

Assistant:

static LY_ERR
lys_precompile_nodeid(const struct ly_ctx *ctx, const char *str, struct lysc_nodeid **nodeid)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyxp_expr *exp = NULL;
    void *mem;
    const char *ptr, *name;
    size_t len;
    uint32_t i;

    *nodeid = NULL;

    /* parse */
    rc = lyxp_expr_parse(ctx, str, strlen(str), 0, &exp);
    LY_CHECK_GOTO(rc, cleanup);

    /* alloc */
    *nodeid = calloc(1, sizeof **nodeid);
    LY_CHECK_ERR_GOTO(!*nodeid, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    /* store the full schema-node-id */
    (*nodeid)->str = str;

    /* absolute vs. relative path */
    i = 0;
    if (exp->tokens[0] == LYXP_TOKEN_NAMETEST) {
        goto relative_path;
    }

    while (i < exp->used) {
        /* skip '/' */
        assert(exp->tokens[i] == LYXP_TOKEN_OPER_PATH);
        ++i;

relative_path:
        /* new node */
        mem = realloc((*nodeid)->prefix, ((*nodeid)->count + 1) * sizeof *(*nodeid)->prefix);
        LY_CHECK_ERR_GOTO(!mem, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        (*nodeid)->prefix = mem;
        (*nodeid)->prefix[(*nodeid)->count] = NULL;

        mem = realloc((*nodeid)->name, ((*nodeid)->count + 1) * sizeof *(*nodeid)->name);
        LY_CHECK_ERR_GOTO(!mem, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        (*nodeid)->name = mem;
        (*nodeid)->name[(*nodeid)->count] = NULL;

        ++(*nodeid)->count;

        /* compile the name test */
        assert(exp->tokens[i] == LYXP_TOKEN_NAMETEST);
        name = str + exp->tok_pos[i];
        len = exp->tok_len[i];
        ptr = ly_strnchr(name, ':', len);
        if (ptr) {
            /* store prefix */
            rc = lydict_insert(ctx, name, ptr - name, &(*nodeid)->prefix[(*nodeid)->count - 1]);
            LY_CHECK_GOTO(rc, cleanup);

            /* move name */
            len -= (ptr - name) + 1;
            name = ptr + 1;
        }

        /* store name */
        rc = lydict_insert(ctx, name, len, &(*nodeid)->name[(*nodeid)->count - 1]);
        LY_CHECK_GOTO(rc, cleanup);

        ++i;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (rc) {
        lysc_nodeid_free(ctx, *nodeid);
        *nodeid = NULL;
    }
    return rc;
}